

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_simul.c
# Opt level: O0

void parse_param_arg(char *arg)

{
  int iVar1;
  char *pcVar2;
  ulong local_38;
  param_t *local_30;
  param_t *p_1;
  uint64_t x;
  param_t *p;
  char *eq;
  char *arg_local;
  
  pcVar2 = strchr(arg,0x3d);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
            ,0xdc,"parse_param_arg");
    fprintf(_stderr,"params need to be var=value, got \"%s\"",arg);
    fprintf(_stderr,"\n");
    abort();
  }
  if (pcVar2[1] == '\0') {
    fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
            "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
            ,0xdf,"parse_param_arg");
    fprintf(_stderr,"empty value in \"%s\"",arg);
    fprintf(_stderr,"\n");
    abort();
  }
  x = (uint64_t)params;
  while( true ) {
    if (*(long *)x == 0) {
      fprintf(_stderr,"Unknown parameter \"%s\"; valid ones:",arg);
      for (local_30 = params; local_30->name != (char *)0x0; local_30 = local_30 + 1) {
        fprintf(_stderr," %s",local_30->name);
      }
      fprintf(_stderr,"\n");
      exit(1);
    }
    iVar1 = strncmp(*(char **)x,arg,(long)pcVar2 - (long)arg);
    if ((iVar1 == 0) && (pcVar2[*(long *)x - (long)arg] == '\0')) break;
    x = x + 0x28;
  }
  if (*(long *)(x + 8) == 0) {
    parse_other_param(pcVar2 + 1,*(char **)x);
  }
  else {
    if (*(long *)(x + 0x20) == 0) {
      local_38 = parse_uint_param(pcVar2 + 1,*(char **)x);
    }
    else {
      local_38 = parse_enum_param(pcVar2 + 1,*(char **)x,*(char ***)(x + 0x20));
    }
    if (local_38 < *(ulong *)(x + 0x10)) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
              ,0xf3,"parse_param_arg");
      fprintf(_stderr,"value for %s too small: wanted %lu..%lu, got %lu",*(undefined8 *)x,
              *(undefined8 *)(x + 0x10),*(undefined8 *)(x + 0x18),local_38);
      fprintf(_stderr,"\n");
      abort();
    }
    if (*(ulong *)(x + 0x18) < local_38) {
      fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
              "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/benchmarks/bench_simul.c"
              ,0xf9,"parse_param_arg");
      fprintf(_stderr,"value for %s too big: wanted %lu..%lu, got %lu",*(undefined8 *)x,
              *(undefined8 *)(x + 0x10),*(undefined8 *)(x + 0x18),local_38);
      fprintf(_stderr,"\n");
      abort();
    }
    **(ulong **)(x + 8) = local_38;
  }
  return;
}

Assistant:

static void parse_param_arg(const char *arg)
{
	const char *eq = strchr(arg, '=');
	if (!eq)
		UT_FATAL("params need to be var=value, got \"%s\"", arg);

	if (!eq[1])
		UT_FATAL("empty value in \"%s\"", arg);

	for (struct param_t *p = params; p->name; p++) {
		if (strncmp(p->name, arg, (size_t)(eq - arg)) ||
			p->name[eq - arg]) {
			continue;
		}

		if (!p->var) {
			parse_other_param(eq + 1, p->name);
			return;
		}

		uint64_t x = p->enums ?
			parse_enum_param(eq + 1, p->name, p->enums) :
			parse_uint_param(eq + 1, p->name);

		if (x < p->min) {
			UT_FATAL(
				"value for %s too small: wanted %lu..%lu, got %lu",
				p->name, p->min, p->max, x);
		}

		if (x > p->max) {
			UT_FATAL(
				"value for %s too big: wanted %lu..%lu, got %lu",
				p->name, p->min, p->max, x);
		}

		*p->var = x;
		return;
	}

	fprintf(stderr, "Unknown parameter \"%s\"; valid ones:", arg);
	for (struct param_t *p = params; p->name; p++)
		fprintf(stderr, " %s", p->name);
	fprintf(stderr, "\n");
	exit(1);
}